

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9GlaRefine(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint fVerbose;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  local_40 = 0;
  fVerbose = 0;
LAB_0023d803:
  do {
    do {
      iVar1 = Extra_UtilGetopt(argc,argv,"FGmvh");
      iVar3 = globalUtilOptind;
    } while (iVar1 == 0x6d);
    if (iVar1 < 0x47) {
      if (iVar1 == -1) {
        p = pAbc->pGia;
        if (p == (Gia_Man_t *)0x0) {
          pcVar4 = "Abc_CommandAbc9GlaRefine(): There is no AIG.\n";
        }
        else {
          if (p->nRegs == 0) {
            Abc_Print(-1,"The network is combinational.\n");
            return 0;
          }
          if (pAbc->pCex != (Abc_Cex_t *)0x0) {
            iVar3 = Gia_ManNewRefine(p,pAbc->pCex,local_3c,local_40,fVerbose);
            pAbc->Status = iVar3;
            Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9GlaRefine(): There is no counter-example.\n";
        }
        iVar3 = -1;
        goto LAB_0023d9d6;
      }
      if (iVar1 != 0x46) goto LAB_0023d94f;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0023d943:
        Abc_Print(-1,pcVar4);
        goto LAB_0023d94f;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      uVar2 = local_3c;
    }
    else {
      if (iVar1 != 0x47) {
        if (iVar1 != 0x76) goto LAB_0023d94f;
        fVerbose = fVerbose ^ 1;
        goto LAB_0023d803;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
        goto LAB_0023d943;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      uVar2 = local_40;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_0023d94f:
      Abc_Print(-2,"usage: &gla_refine [-FG num] [-vh]\n");
      Abc_Print(-2,"\t         refines the pre-computed gate map using the counter-example\n");
      Abc_Print(-2,"\t-F num : starting timeframe for suffix refinement [default = %d]\n",
                (ulong)local_3c);
      Abc_Print(-2,"\t-G num : the number of additional timeframes to try [default = %d]\n",
                (ulong)local_40);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0023d9d6:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GlaRefine( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManNewRefine( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrameStart, int iFrameExtra, int fVerbose );
    int iFrameStart = 0;
    int iFrameExtra = 0;
    int fMinCut = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FGmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrameStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrameStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrameExtra = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrameExtra < 0 )
                goto usage;
            break;
        case 'm':
            fMinCut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaRefine(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaRefine(): There is no counter-example.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManNewRefine( pAbc->pGia, pAbc->pCex, iFrameStart, iFrameExtra, fVerbose );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_refine [-FG num] [-vh]\n" );
    Abc_Print( -2, "\t         refines the pre-computed gate map using the counter-example\n" );
    Abc_Print( -2, "\t-F num : starting timeframe for suffix refinement [default = %d]\n", iFrameStart );
    Abc_Print( -2, "\t-G num : the number of additional timeframes to try [default = %d]\n", iFrameExtra );
//    Abc_Print( -2, "\t-m     : toggle using min-cut to derive the refinements [default = %s]\n", fMinCut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}